

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

uint cmSystemTools::RandomSeed(void)

{
  uint uVar1;
  long *plVar2;
  anon_union_4_2_474df5d4 seed;
  timeval t;
  ifstream fin;
  long local_210;
  long local_208 [2];
  int aiStack_1f8 [122];
  
  std::ifstream::ifstream(&fin);
  (**(code **)(local_208[0] + 0x18))(local_208,0,0);
  std::ifstream::open((char *)&fin,0x220cfc);
  if (((*(int *)((long)aiStack_1f8 + *(long *)(_fin + -0x18)) != 0) ||
      (plVar2 = (long *)std::istream::read((char *)&fin,(long)&seed),
      (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0)) || (local_210 != 4))
  {
    gettimeofday((timeval *)&t,(__timezone_ptr_t)0x0);
    uVar1 = getpid();
    seed.integer = uVar1 ^ (uint)t.tv_sec ^ (int)t.tv_usec << 0x15;
  }
  std::ifstream::~ifstream(&fin);
  return seed.integer;
}

Assistant:

unsigned int cmSystemTools::RandomSeed()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  unsigned int seed = 0;

  // Try using a real random source.
  if (WinCryptRandom(&seed, sizeof(seed))) {
    return seed;
  }

  // Fall back to the time and pid.
  FILETIME ft;
  GetSystemTimeAsFileTime(&ft);
  unsigned int t1 = static_cast<unsigned int>(ft.dwHighDateTime);
  unsigned int t2 = static_cast<unsigned int>(ft.dwLowDateTime);
  unsigned int pid = static_cast<unsigned int>(GetCurrentProcessId());
  return t1 ^ t2 ^ pid;
#else
  union
  {
    unsigned int integer;
    char bytes[sizeof(unsigned int)];
  } seed;

  // Try using a real random source.
  cmsys::ifstream fin;
  fin.rdbuf()->pubsetbuf(nullptr, 0); // Unbuffered read.
  fin.open("/dev/urandom");
  if (fin.good() && fin.read(seed.bytes, sizeof(seed)) &&
      fin.gcount() == sizeof(seed)) {
    return seed.integer;
  }

  // Fall back to the time and pid.
  struct timeval t;
  gettimeofday(&t, nullptr);
  unsigned int pid = static_cast<unsigned int>(getpid());
  unsigned int tv_sec = static_cast<unsigned int>(t.tv_sec);
  unsigned int tv_usec = static_cast<unsigned int>(t.tv_usec);
  // Since tv_usec never fills more than 11 bits we shift it to fill
  // in the slow-changing high-order bits of tv_sec.
  return tv_sec ^ (tv_usec << 21) ^ pid;
#endif
}